

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChParticleCloud.cpp
# Opt level: O2

void __thiscall chrono::ChParticleCloud::SetCollide(ChParticleCloud *this,bool mcoll)

{
  uint uVar1;
  __shared_ptr<chrono::collision::ChCollisionSystem,_(__gnu_cxx::_Lock_policy)2> local_38;
  
  if (this->do_collide != mcoll) {
    if (mcoll) {
      this->do_collide = true;
      if ((this->super_ChIndexedParticles).super_ChPhysicsItem.system != (ChSystem *)0x0) {
        for (uVar1 = 0;
            (ulong)uVar1 <
            (ulong)((long)(this->particles).
                          super__Vector_base<chrono::ChAparticle_*,_std::allocator<chrono::ChAparticle_*>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(this->particles).
                          super__Vector_base<chrono::ChAparticle_*,_std::allocator<chrono::ChAparticle_*>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 3); uVar1 = uVar1 + 1) {
          std::__shared_ptr<chrono::collision::ChCollisionSystem,_(__gnu_cxx::_Lock_policy)2>::
          __shared_ptr(&local_38,
                       &(((this->super_ChIndexedParticles).super_ChPhysicsItem.system)->
                        collision_system).
                        super___shared_ptr<chrono::collision::ChCollisionSystem,_(__gnu_cxx::_Lock_policy)2>
                      );
          (*(local_38._M_ptr)->_vptr_ChCollisionSystem[4])
                    (local_38._M_ptr,
                     (this->particles).
                     super__Vector_base<chrono::ChAparticle_*,_std::allocator<chrono::ChAparticle_*>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar1]->collision_model);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_38._M_refcount);
        }
      }
    }
    else {
      this->do_collide = false;
      if ((this->super_ChIndexedParticles).super_ChPhysicsItem.system != (ChSystem *)0x0) {
        for (uVar1 = 0;
            (ulong)uVar1 <
            (ulong)((long)(this->particles).
                          super__Vector_base<chrono::ChAparticle_*,_std::allocator<chrono::ChAparticle_*>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(this->particles).
                          super__Vector_base<chrono::ChAparticle_*,_std::allocator<chrono::ChAparticle_*>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 3); uVar1 = uVar1 + 1) {
          std::__shared_ptr<chrono::collision::ChCollisionSystem,_(__gnu_cxx::_Lock_policy)2>::
          __shared_ptr(&local_38,
                       &(((this->super_ChIndexedParticles).super_ChPhysicsItem.system)->
                        collision_system).
                        super___shared_ptr<chrono::collision::ChCollisionSystem,_(__gnu_cxx::_Lock_policy)2>
                      );
          (*(local_38._M_ptr)->_vptr_ChCollisionSystem[5])
                    (local_38._M_ptr,
                     (this->particles).
                     super__Vector_base<chrono::ChAparticle_*,_std::allocator<chrono::ChAparticle_*>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar1]->collision_model);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_38._M_refcount);
        }
      }
    }
  }
  return;
}

Assistant:

void ChParticleCloud::SetCollide(bool mcoll) {
    if (mcoll == do_collide)
        return;

    if (mcoll) {
        do_collide = true;
        if (GetSystem()) {
            for (unsigned int j = 0; j < particles.size(); j++) {
                GetSystem()->GetCollisionSystem()->Add(particles[j]->collision_model);
            }
        }
    } else {
        do_collide = false;
        if (GetSystem()) {
            for (unsigned int j = 0; j < particles.size(); j++) {
                GetSystem()->GetCollisionSystem()->Remove(particles[j]->collision_model);
            }
        }
    }
}